

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  long lVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TString *pTVar6;
  int in_EDX;
  LexState *in_RSI;
  uint *in_RDI;
  int cont;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar8;
  
  uVar8 = 0;
  save((LexState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
       in_stack_ffffffffffffffdc);
  lVar1 = **(long **)(in_RDI + 0x10);
  **(long **)(in_RDI + 0x10) = lVar1 + -1;
  if (lVar1 == 0) {
    uVar3 = luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
    *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
    uVar3 = (uint)*pbVar2;
  }
  *in_RDI = uVar3;
  if ((*in_RDI == 10) || (*in_RDI == 0xd)) {
    inclinenumber((LexState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  do {
    while( true ) {
      while( true ) {
        while (uVar7 = *in_RDI, uVar7 == 0xffffffff) {
          luaX_lexerror(ls,(char *)seminfo,sep);
        }
        if ((uVar7 != 10) && (uVar7 != 0xd)) break;
        save((LexState *)CONCAT44(uVar3,uVar7),in_stack_ffffffffffffffdc);
        inclinenumber((LexState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (in_RSI == (LexState *)0x0) {
          *(undefined8 *)(*(long *)(in_RDI + 0x12) + 8) = 0;
        }
      }
      if (uVar7 == 0x5d) break;
      if (in_RSI == (LexState *)0x0) {
        lVar1 = **(long **)(in_RDI + 0x10);
        **(long **)(in_RDI + 0x10) = lVar1 + -1;
        if (lVar1 == 0) {
          in_stack_ffffffffffffffd4 =
               luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        }
        else {
          pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
          *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
          in_stack_ffffffffffffffd4 = (uint)*pbVar2;
        }
        *in_RDI = in_stack_ffffffffffffffd4;
      }
      else {
        save((LexState *)CONCAT44(uVar3,uVar7),in_stack_ffffffffffffffdc);
        lVar1 = **(long **)(in_RDI + 0x10);
        **(long **)(in_RDI + 0x10) = lVar1 + -1;
        if (lVar1 == 0) {
          in_stack_ffffffffffffffd8 =
               luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        }
        else {
          pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
          *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
          in_stack_ffffffffffffffd8 = (uint)*pbVar2;
        }
        *in_RDI = in_stack_ffffffffffffffd8;
      }
    }
    iVar4 = skip_sep((LexState *)CONCAT44(uVar3,0x5d));
  } while (iVar4 != in_EDX);
  save((LexState *)CONCAT44(uVar3,uVar7),in_stack_ffffffffffffffdc);
  lVar1 = **(long **)(in_RDI + 0x10);
  **(long **)(in_RDI + 0x10) = lVar1 + -1;
  if (lVar1 == 0) {
    uVar5 = luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    pbVar2 = *(byte **)(*(long *)(in_RDI + 0x10) + 8);
    *(byte **)(*(long *)(in_RDI + 0x10) + 8) = pbVar2 + 1;
    uVar5 = (uint)*pbVar2;
  }
  *in_RDI = uVar5;
  if (in_RSI != (LexState *)0x0) {
    pTVar6 = luaX_newstring(in_RSI,(char *)CONCAT44(in_EDX,uVar8),CONCAT44(uVar3,uVar7));
    *(TString **)in_RSI = pTVar6;
  }
  return;
}

Assistant:

static void read_long_string(LexState*ls,SemInfo*seminfo,int sep){
int cont=0;
(void)(cont);
save_and_next(ls);
if(currIsNewline(ls))
inclinenumber(ls);
for(;;){
switch(ls->current){
case(-1):
luaX_lexerror(ls,(seminfo)?"unfinished long string":
"unfinished long comment",TK_EOS);
break;
case']':{
if(skip_sep(ls)==sep){
save_and_next(ls);
goto endloop;
}
break;
}
case'\n':
case'\r':{
save(ls,'\n');
inclinenumber(ls);
if(!seminfo)luaZ_resetbuffer(ls->buff);
break;
}
default:{
if(seminfo)save_and_next(ls);
else next(ls);
}
}
}endloop:
if(seminfo)
seminfo->ts=luaX_newstring(ls,luaZ_buffer(ls->buff)+(2+sep),
luaZ_bufflen(ls->buff)-2*(2+sep));
}